

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O0

uint32_t mipsdsp_rnd32_rashift(uint32_t a,uint8_t s)

{
  undefined8 local_18;
  int64_t temp;
  uint8_t s_local;
  uint32_t a_local;
  
  if (s == '\0') {
    local_18 = (ulong)a << 1;
  }
  else {
    local_18 = (long)(int)a >> (s - 1 & 0x3f);
  }
  return (uint32_t)(local_18 + 1 >> 1);
}

Assistant:

static inline uint32_t mipsdsp_rnd32_rashift(uint32_t a, uint8_t s)
{
    int64_t temp;

    if (s == 0) {
        temp = (uint64_t)a << 1;
    } else {
        temp = (int64_t)(int32_t)a >> (s - 1);
    }
    temp += 1;

    return (temp >> 1) & 0xFFFFFFFFull;
}